

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

MPP_RET dec_vproc_set_dei_v2(MppDecVprocCtx *vproc_ctx,MppFrame frm)

{
  MppVprocMode vproc_mode;
  MppDecVprocCtxImpl *ctx;
  MPP_RET ret;
  MppFrame frm_local;
  MppDecVprocCtx *vproc_ctx_local;
  
  ctx._4_4_ = MPP_OK;
  if (*(int *)(vproc_ctx + 0x19) == 1) {
    dec_vproc_dei_v2_deinterlace((MppDecVprocCtxImpl *)vproc_ctx,frm);
  }
  else if (*(int *)(vproc_ctx + 0x19) == 2) {
    dec_vproc_dei_v2_detection((MppDecVprocCtxImpl *)vproc_ctx,frm);
  }
  else {
    _mpp_log_l(2,"mpp_dec_vproc","warning: vproc mode unknown!\n",(char *)0x0);
    ctx._4_4_ = MPP_NOK;
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET dec_vproc_set_dei_v2(MppDecVprocCtx *vproc_ctx, MppFrame frm)
{
    MPP_RET ret = MPP_OK;
    MppDecVprocCtxImpl *ctx = (MppDecVprocCtxImpl *)vproc_ctx;
    /*     RK_U32 mode = mpp_frame_get_mode(frm);
        enum IEP2_DIL_MODE dil_mode = IEP2_DIL_MODE_DISABLE; */
    MppVprocMode vproc_mode = ctx->vproc_mode;

    switch (vproc_mode) {
    case MPP_VPROC_MODE_DETECTION: {
        dec_vproc_dei_v2_detection(ctx, frm);
    } break;
    case MPP_VPROC_MODE_DEINTELACE: {
        dec_vproc_dei_v2_deinterlace(ctx, frm);
    } break;
    default: {
        mpp_err("warning: vproc mode unknown!\n");
        ret = MPP_NOK;
    } break;
    }

    return ret;
}